

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O3

int who(vector<cUser,_std::allocator<cUser>_> *currUsers,int new_fd)

{
  size_type *psVar1;
  pointer paVar2;
  pointer pcVar3;
  ssize_t sVar4;
  int iVar5;
  pointer paVar6;
  undefined1 local_a0 [8];
  cUser user;
  undefined1 local_68 [16];
  size_type *local_58;
  string names;
  
  local_58 = &names._M_string_length;
  names._M_dataplus._M_p = (pointer)0x0;
  names._M_string_length._0_1_ = 0;
  paVar6 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
           super__Vector_impl_data._M_start;
  paVar2 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar6 != paVar2) {
    psVar1 = &user.username._M_string_length;
    names.field_2._12_4_ = new_fd;
    do {
      pcVar3 = (paVar6->username)._M_dataplus._M_p;
      local_a0 = (undefined1  [8])psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a0,pcVar3,pcVar3 + (paVar6->username)._M_string_length);
      user.username.field_2._8_4_ = paVar6->id;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&user.id,
                     " ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0);
      std::__cxx11::string::_M_append((char *)&local_58,user._32_8_);
      if ((undefined1 *)user._32_8_ != local_68) {
        operator_delete((void *)user._32_8_);
      }
      if (local_a0 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_a0);
      }
      paVar6 = paVar6 + 1;
    } while (paVar6 != paVar2);
    new_fd = names.field_2._12_4_;
    if ((pointer)0xff < names._M_dataplus._M_p) {
      iVar5 = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"We in some trouble with this",0x1c);
      goto LAB_00106e5e;
    }
  }
  sVar4 = send(new_fd,local_58,0xff,0);
  iVar5 = 1;
  if (sVar4 == -1) {
    perror("send");
  }
LAB_00106e5e:
  if (local_58 != &names._M_string_length) {
    operator_delete(local_58);
  }
  return iVar5;
}

Assistant:

int who(vector<cUser>& currUsers,int new_fd){
    string names;

    // add all the currently logged in user's names to the string
    for(cUser user : currUsers){
        names += (" " + user.username);
    }

    // make sure its not to long
    if(names.length() > MAXDATASIZE - 1){
        cerr << "We in some trouble with this";
        return 0;
    }

    //send it back to the client
    if (send(new_fd, names.c_str(), MAXDATASIZE - 1, 0) == -1)
        perror("send");

    return 1;

}